

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundDefaultExpression::Deserialize(BoundDefaultExpression *this,Deserializer *deserializer)

{
  BoundDefaultExpression *this_00;
  LogicalType return_type;
  LogicalType LStack_48;
  LogicalType local_30;
  
  (*deserializer->_vptr_Deserializer[2])(deserializer,200,"return_type");
  (*deserializer->_vptr_Deserializer[6])(deserializer);
  LogicalType::Deserialize(&LStack_48,deserializer);
  (*deserializer->_vptr_Deserializer[7])(deserializer);
  (*deserializer->_vptr_Deserializer[3])(deserializer);
  this_00 = (BoundDefaultExpression *)operator_new(0x58);
  LogicalType::LogicalType(&local_30,&LStack_48);
  BoundDefaultExpression(this_00,&local_30);
  LogicalType::~LogicalType(&local_30);
  (this->super_Expression).super_BaseExpression._vptr_BaseExpression = (_func_int **)this_00;
  LogicalType::~LogicalType(&LStack_48);
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> BoundDefaultExpression::Deserialize(Deserializer &deserializer) {
	auto return_type = deserializer.ReadProperty<LogicalType>(200, "return_type");
	auto result = duckdb::unique_ptr<BoundDefaultExpression>(new BoundDefaultExpression(std::move(return_type)));
	return std::move(result);
}